

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O0

void __thiscall QtPrivate::QColorPicker::resizeEvent(QColorPicker *this,QResizeEvent *ev)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 *puVar6;
  QResizeEvent *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  uint *end;
  uint *pixel;
  int y;
  int x;
  int h;
  int w;
  QPoint p;
  QImage img;
  QColor c;
  int in_stack_ffffffffffffff48;
  ImageConversionFlag in_stack_ffffffffffffff4c;
  QPoint *in_stack_ffffffffffffff50;
  QPixmap *other;
  QColorPicker *in_stack_ffffffffffffff58;
  QPixmap *this_00;
  undefined4 *local_80;
  int local_78;
  QPixmap local_50 [24];
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QWidget::resizeEvent(in_RDI,in_RSI);
  iVar1 = QWidget::width((QWidget *)0x733ac4);
  iVar2 = QFrame::frameWidth((QFrame *)in_stack_ffffffffffffff50);
  iVar1 = iVar1 + iVar2 * -2;
  iVar3 = QWidget::height((QWidget *)0x733aea);
  iVar2 = QFrame::frameWidth((QFrame *)in_stack_ffffffffffffff50);
  iVar3 = iVar3 + iVar2 * -2;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  QImage::QImage((QImage *)&local_30,iVar1,iVar3,Format_RGB32);
  local_80 = (undefined4 *)QImage::scanLine((int)&local_30);
  for (local_78 = 0; local_78 < iVar3; local_78 = local_78 + 1) {
    puVar6 = local_80 + iVar1;
    for (; local_80 < puVar6; local_80 = local_80 + 1) {
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      QPoint::QPoint(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      QColor::QColor((QColor *)0x733c04);
      iVar2 = huePt(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      iVar4 = satPt(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      QColor::setHsv((int)&local_18,iVar2,iVar4,200);
      uVar5 = QColor::rgb();
      *local_80 = uVar5;
    }
  }
  QFlags<Qt::ImageConversionFlag>::QFlags
            ((QFlags<Qt::ImageConversionFlag> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c)
  ;
  other = local_50;
  this_00 = (QPixmap *)&local_30;
  QPixmap::fromImage((QImage *)other,(QFlags_conflict1 *)this_00);
  QPixmap::operator=(this_00,other);
  QPixmap::~QPixmap(other);
  QImage::~QImage((QImage *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorPicker::resizeEvent(QResizeEvent *ev)
{
    QFrame::resizeEvent(ev);

    int w = width() - frameWidth() * 2;
    int h = height() - frameWidth() * 2;
    QImage img(w, h, QImage::Format_RGB32);
    int x, y;
    uint *pixel = (uint *) img.scanLine(0);
    for (y = 0; y < h; y++) {
        const uint *end = pixel + w;
        x = 0;
        while (pixel < end) {
            QPoint p(x, y);
            QColor c;
            c.setHsv(huePt(p), satPt(p), 200);
            *pixel = c.rgb();
            ++pixel;
            ++x;
        }
    }
    pix = QPixmap::fromImage(img);
}